

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ldst_fp(DisasContext_conflict2 *s,int opsize,TCGv_i32 addr,TCGv_ptr fp,ea_what what,
                int index)

{
  TCGContext_conflict2 *tcg_ctx;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_2;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_temp_new_i64(tcg_ctx);
  tcg_temp_new_i32(tcg_ctx);
  if (what != EA_STORE) {
    (*(code *)(&DAT_00b8b268 + *(int *)(&DAT_00b8b268 + (ulong)(uint)opsize * 4)))();
    return;
  }
  (*(code *)(&DAT_00b8b284 + *(int *)(&DAT_00b8b284 + (ulong)(uint)opsize * 4)))();
  return;
}

Assistant:

static void gen_ldst_fp(DisasContext *s, int opsize, TCGv addr,
                        TCGv_ptr fp, ea_what what, int index)
{
    if (what == EA_STORE) {
        gen_store_fp(s, opsize, addr, fp, index);
    } else {
        gen_load_fp(s, opsize, addr, fp, index);
    }
}